

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

ByteArray __thiscall asl::File::firstBytes(File *this,int n)

{
  uint uVar1;
  uchar *puVar2;
  ssize_t sVar3;
  size_t in_RCX;
  uint in_EDX;
  undefined4 in_register_00000034;
  File *this_00;
  int n_local;
  File *this_local;
  ByteArray *data;
  
  this_00 = (File *)CONCAT44(in_register_00000034,n);
  Array<unsigned_char>::Array((Array<unsigned_char> *)this,in_EDX);
  if ((this_00->_file == (FILE *)0x0) &&
     (uVar1 = open(this_00,(char *)&this_00->_path,0), (uVar1 & 1) == 0)) {
    Array<unsigned_char>::clear((Array<unsigned_char> *)this);
  }
  else {
    puVar2 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)this,0);
    sVar3 = read(this_00,(int)puVar2,(void *)(ulong)in_EDX,in_RCX);
    Array<unsigned_char>::resize((Array<unsigned_char> *)this,(int)sVar3);
  }
  return (ByteArray)(uchar *)this;
}

Assistant:

ByteArray File::firstBytes(int n)
{
	ByteArray data(n);
	if (!_file && !open(_path)) {
		data.clear();
		return data;
	}
	data.resize(read(&data[0], n));
	return data;
}